

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_write_qcx(opj_j2k_t *j2k,int compno)

{
  opj_cio_t *cio;
  opj_tccp_t *poVar1;
  int iVar2;
  int n;
  uint uVar3;
  ulong uVar4;
  
  cio = j2k->cio;
  poVar1 = j2k->cp->tcps[j2k->curtileno].tccps;
  uVar3 = 1;
  cio_write(cio,(ulong)(poVar1[compno].numgbits * 0x20 + poVar1[compno].qntsty),1);
  if ((poVar1[compno].qntsty == 1) ||
     (uVar3 = poVar1[compno].numresolutions * 3 - 2, 0 < (int)uVar3)) {
    uVar4 = 0;
    do {
      iVar2 = poVar1[compno].stepsizes[uVar4].expn;
      if (poVar1[compno].qntsty == 0) {
        iVar2 = iVar2 << 3;
        n = 1;
      }
      else {
        iVar2 = iVar2 * 0x800 + poVar1[compno].stepsizes[uVar4].mant;
        n = 2;
      }
      cio_write(cio,(long)iVar2,n);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

static void j2k_write_qcx(opj_j2k_t *j2k, int compno) {
	int bandno, numbands;
	int expn, mant;
	
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_tccp_t *tccp = &tcp->tccps[compno];
	opj_cio_t *cio = j2k->cio;
	
	cio_write(cio, tccp->qntsty + (tccp->numgbits << 5), 1);	/* Sqcx */
	numbands = tccp->qntsty == J2K_CCP_QNTSTY_SIQNT ? 1 : tccp->numresolutions * 3 - 2;
	
	for (bandno = 0; bandno < numbands; bandno++) {
		expn = tccp->stepsizes[bandno].expn;
		mant = tccp->stepsizes[bandno].mant;
		
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			cio_write(cio, expn << 3, 1);	/* SPqcx_i */
		} else {
			cio_write(cio, (expn << 11) + mant, 2);	/* SPqcx_i */
		}
	}
}